

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bessel.c
# Opt level: O2

double xc_bessel_K1(double x)

{
  char *__ptr;
  double dVar1;
  double dVar2;
  double dVar3;
  size_t sStack_40;
  
  if (x <= 0.0) {
    __ptr = "Domain error in bessel_K1\n";
    sStack_40 = 0x1a;
  }
  else {
    if (4.450147717014403e-308 <= x) {
      if (2.0 < x) {
        dVar1 = exp(-x);
        dVar2 = xc_bessel_K1_scaled(x);
        return dVar2 * dVar1;
      }
      dVar1 = log(x * 0.5);
      dVar2 = xc_bessel_I1(x);
      dVar3 = xc_cheb_eval(x * 0.5 * x + -1.0,bk1_data,0xb);
      return (dVar3 + 0.75) / x + dVar2 * dVar1;
    }
    __ptr = "Overflow error in bessel_K1\n";
    sStack_40 = 0x1c;
  }
  fwrite(__ptr,sStack_40,1,_stderr);
  return 0.0;
}

Assistant:

GPU_FUNCTION
double xc_bessel_K1(const double x)
{
  double r = 0.0;

  if(x <= 0.0) {
#ifndef HAVE_CUDA
    fprintf(stderr, "Domain error in bessel_K1\n");
#endif
  } else if(x<2.0*DBL_MIN) {
#ifndef HAVE_CUDA
    fprintf(stderr, "Overflow error in bessel_K1\n");
#endif
  }
  else if(x <= 2.0)
    r = log(0.5*x)*xc_bessel_I1(x) + (0.75 + xc_cheb_eval(0.5*x*x - 1.0, bk1_data, 11))/x;
  else
    r = exp(-x)*xc_bessel_K1_scaled(x);

  return r;
}